

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O0

void __thiscall
agge::tests::PathGeneratorAdapterTests::SubpathIsFullyPassedToGenerator
          (PathGeneratorAdapterTests *this)

{
  passthrough_generator *in_RCX;
  point pVar1;
  allocator local_2e1;
  string local_2e0 [32];
  LocationInfo local_2c0;
  undefined1 auStack_298 [8];
  point reference2 [5];
  allocator local_239;
  string local_238 [32];
  LocationInfo local_218;
  size_type local_1f0;
  uint local_1e4;
  undefined8 local_1e0;
  int local_1d8;
  undefined8 local_1d0;
  int local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined8 local_1b0;
  undefined4 local_1a8;
  allocator local_1a1;
  string local_1a0 [32];
  LocationInfo local_180;
  undefined1 auStack_158 [8];
  point reference1 [2];
  undefined1 local_f8 [8];
  path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
  pg;
  undefined1 local_b0 [8];
  passthrough_generator g;
  path p;
  point input [7];
  PathGeneratorAdapterTests *this_local;
  
  p.position = 0x40e0000040000000;
  tests::mocks::path::path<agge::tests::mocks::path::point,7ul>
            ((path *)&g.kx,(point (*) [7])&p.position);
  anon_unknown_2::passthrough_generator::passthrough_generator((passthrough_generator *)local_b0);
  assist<agge::tests::mocks::path,agge::tests::(anonymous_namespace)::passthrough_generator>
            ((path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
              *)local_f8,(agge *)&g.kx,(path *)local_b0,in_RCX);
  std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  resize((vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
          *)local_b0,3,(value_type)ZEXT812(0));
  vertex<agge::path_generator_adapter<agge::tests::mocks::path,agge::tests::(anonymous_namespace)::passthrough_generator>>
            ((path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
              *)local_f8);
  reference1[0].command = 0x419d999a;
  reference1[1].x = 2.8026e-45;
  auStack_158._0_4_ = 2.0;
  auStack_158._4_4_ = 7.0;
  reference1[0].x = 1.4013e-45;
  reference1[0].y = 37.1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,&local_1a1);
  ut::LocationInfo::LocationInfo(&local_180,(string *)local_1a0,0xe2);
  ut::
  are_equal<agge::tests::mocks::path::point,2ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            ((point (*) [2])auStack_158,
             (vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
              *)local_b0,&local_180);
  ut::LocationInfo::~LocationInfo(&local_180);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  local_1a8 = 0;
  local_1b0 = 0;
  local_1b8 = 0;
  local_1c0 = 0;
  std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  resize((vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
          *)local_b0,0x11,(value_type)ZEXT812(0));
  pVar1 = vertex<agge::path_generator_adapter<agge::tests::mocks::path,agge::tests::(anonymous_namespace)::passthrough_generator>>
                    ((path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
                      *)local_f8);
  local_1d8 = pVar1.command;
  local_1e0 = pVar1._0_8_;
  local_1e4 = 0x11;
  local_1d0 = local_1e0;
  local_1c8 = local_1d8;
  local_1f0 = std::
              vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
              ::size((vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_238,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,&local_239);
  ut::LocationInfo::LocationInfo(&local_218,(string *)local_238,0xeb);
  ut::are_equal<unsigned_int,unsigned_long>(&local_1e4,&local_1f0,&local_218);
  ut::LocationInfo::~LocationInfo(&local_218);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  pVar1 = vertex<agge::path_generator_adapter<agge::tests::mocks::path,agge::tests::(anonymous_namespace)::passthrough_generator>>
                    ((path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
                      *)local_f8);
  unique0x10000281 = pVar1._0_8_;
  reference2[3].y = 1.0;
  reference2[3].command = 0x41880000;
  reference2[4].x = 2.8026e-45;
  reference2[2].x = 2.8026e-45;
  reference2[2].y = 11.0;
  reference2[2].command = 0x41b80000;
  reference2[3].x = 2.8026e-45;
  reference2[0].command = 0x40e9999a;
  reference2[1].x = 2.8026e-45;
  reference2[1].y = 171.1;
  reference2[1].command = 0x419d999a;
  auStack_298._0_4_ = 11.0;
  auStack_298._4_4_ = 23.0;
  reference2[0].x = 1.4013e-45;
  reference2[0].y = 2.3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,&local_2e1);
  ut::LocationInfo::LocationInfo(&local_2c0,(string *)local_2e0,0xf9);
  ut::
  are_equal<agge::tests::mocks::path::point,5ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            ((point (*) [5])auStack_298,
             (vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
              *)local_b0,&local_2c0);
  ut::LocationInfo::~LocationInfo(&local_2c0);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
  ::~path_generator_adapter
            ((path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
              *)local_f8);
  anon_unknown_2::passthrough_generator::~passthrough_generator((passthrough_generator *)local_b0);
  tests::mocks::path::~path((path *)&g.kx);
  return;
}

Assistant:

test( SubpathIsFullyPassedToGenerator )
			{
				// INIT
				mocks::path::point input[] = {
					{ 2.0f, 7.0f, path_command_move_to },
					{ 37.1f, 19.7f, path_command_line_to },
					{ 11.0f, 23.0f, path_command_move_to },
					{ 2.3f, 7.3f, path_command_line_to },
					{ 171.1f, 19.7f, path_command_line_to },
					{ 11.0f, 23.0f, path_command_line_to },
					{ 1.0f, 17.0f, path_command_line_to },
				};
				mocks::path p(input);
				passthrough_generator g;
				path_generator_adapter<mocks::path, passthrough_generator> pg = assist(p, g);

				g.points.resize(3); // Resize to check if its cleared.

				// ACT
				vertex(pg);

				// ASSERT
				mocks::path::point reference1[] = {
					{ 2.0f, 7.0f, path_command_move_to },
					{ 37.1f, 19.7f, path_command_line_to },
				};

				assert_equal(reference1, g.points);

				// INIT
				g.points.resize(17);

				// ACT
				vertex(pg);

				// ASSERT
				assert_equal(17u, g.points.size()); // no change

				// ACT (new subpath)
				vertex(pg);

				// ASSERT
				mocks::path::point reference2[] = {
					{ 11.0f, 23.0f, path_command_move_to },
					{ 2.3f, 7.3f, path_command_line_to },
					{ 171.1f, 19.7f, path_command_line_to },
					{ 11.0f, 23.0f, path_command_line_to },
					{ 1.0f, 17.0f, path_command_line_to },
				};

				assert_equal(reference2, g.points);
			}